

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O2

void __thiscall
JsUtil::
List<Wasm::WasmFunctionInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
Reset(List<Wasm::WasmFunctionInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      *this)

{
  WriteBarrierPtr<Wasm::WasmFunctionInfo> *buffer;
  
  buffer = (this->super_ReadOnlyList<Wasm::WasmFunctionInfo_*,_Memory::Recycler,_DefaultComparer>).
           buffer.ptr;
  if (buffer != (WriteBarrierPtr<Wasm::WasmFunctionInfo> *)0x0) {
    Memory::Recycler::ExplicitFreeNonLeaf
              ((this->
               super_ReadOnlyList<Wasm::WasmFunctionInfo_*,_Memory::Recycler,_DefaultComparer>).
               alloc,buffer,(long)this->length << 3);
    (this->super_ReadOnlyList<Wasm::WasmFunctionInfo_*,_Memory::Recycler,_DefaultComparer>).buffer.
    ptr = (WriteBarrierPtr<Wasm::WasmFunctionInfo> *)0x0;
    (this->super_ReadOnlyList<Wasm::WasmFunctionInfo_*,_Memory::Recycler,_DefaultComparer>).count =
         0;
    this->length = 0;
  }
  return;
}

Assistant:

void Reset()
        {
            if (this->buffer != nullptr)
            {
                auto freeFunc = AllocatorInfo::GetFreeFunc();
                AllocatorFree(this->alloc, freeFunc, this->buffer, sizeof(T) * length); // TODO: Better version of DeleteArray?

                this->buffer = nullptr;
                this->count = 0;
                length = 0;
            }
        }